

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gem_points.cpp
# Opt level: O0

void __thiscall
Am_Point_List_Data::Add(Am_Point_List_Data *this,float x,float y,Am_Add_Position position)

{
  Am_Point_Item *this_00;
  Am_Point_Item *item;
  Am_Add_Position position_local;
  float y_local;
  float x_local;
  Am_Point_List_Data *this_local;
  
  *(short *)&(this->super_Am_Wrapper).field_0xc = *(short *)&(this->super_Am_Wrapper).field_0xc + 1;
  this_00 = (Am_Point_Item *)operator_new(0x18);
  Am_Point_Item::Am_Point_Item(this_00,x,y);
  if (position == Am_HEAD) {
    if (this->head == (Am_Point_Item *)0x0) {
      this->tail = this_00;
    }
    else {
      this->head->prev = this_00;
    }
    this_00->prev = (Am_Point_Item *)0x0;
    this_00->next = this->head;
    this->head = this_00;
  }
  else {
    if (this->tail == (Am_Point_Item *)0x0) {
      this->head = this_00;
    }
    else {
      this->tail->next = this_00;
    }
    this_00->next = (Am_Point_Item *)0x0;
    this_00->prev = this->tail;
    this->tail = this_00;
  }
  return;
}

Assistant:

void
Am_Point_List_Data::Add(float x, float y, Am_Add_Position position)
{
  ++number;
  Am_Point_Item *item = new Am_Point_Item(x, y);
  if (position == Am_HEAD) {
    if (head)
      head->prev = item;
    else
      tail = item;
    item->prev = nullptr;
    item->next = head;
    head = item;
  } else {
    if (tail)
      tail->next = item;
    else
      head = item;
    item->next = nullptr;
    item->prev = tail;
    tail = item;
  }
}